

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O0

HAnimHierarchy * rw::HAnimHierarchy::find(Frame *f)

{
  HAnimHierarchy *hier;
  Frame *f_local;
  
  if (f == (Frame *)0x0) {
    f_local = (Frame *)0x0;
  }
  else {
    f_local = (Frame *)get(f);
    if ((f_local == (Frame *)0x0) && (f_local = (Frame *)find(f->next), f_local == (Frame *)0x0)) {
      f_local = (Frame *)find(f->child);
    }
  }
  return (HAnimHierarchy *)f_local;
}

Assistant:

HAnimHierarchy*
HAnimHierarchy::find(Frame *f)
{
	if(f == nil) return nil;
	HAnimHierarchy *hier = HAnimHierarchy::get(f);
	if(hier) return hier;
	hier = HAnimHierarchy::find(f->next);
	if(hier) return hier;
	return HAnimHierarchy::find(f->child);
}